

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

size_t OPENSSL_strlcpy(char *dst,char *src,size_t dst_size)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  lVar3 = 0;
  for (sVar1 = dst_size; 1 < sVar1; sVar1 = sVar1 - 1) {
    if (src[lVar3] == '\0') goto LAB_003987c8;
    dst[lVar3] = src[lVar3];
    lVar3 = lVar3 + 1;
  }
  if (dst_size != 0) {
LAB_003987c8:
    dst[lVar3] = '\0';
  }
  sVar2 = strlen(src + lVar3);
  return sVar2 + lVar3;
}

Assistant:

size_t OPENSSL_strlcpy(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;

  for (; dst_size > 1 && *src; dst_size--) {
    *dst++ = *src++;
    l++;
  }

  if (dst_size) {
    *dst = 0;
  }

  return l + strlen(src);
}